

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Reader * __thiscall
capnp::Orphan<capnp::DynamicValue>::getReader
          (Reader *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  undefined8 uVar1;
  ListReader reader;
  StructReader reader_00;
  ListSchema schema;
  ElementSize elementSize;
  Which elementType;
  DynamicEnum value;
  Fault local_198;
  Fault f;
  undefined1 local_180 [48];
  Schema local_150;
  StructSize local_144;
  StructReader local_140;
  Schema local_110;
  Reader local_108;
  ListReader local_d0;
  int64_t local_a0;
  anon_union_8_2_eba6ea51_for_Type_5 local_98;
  Reader local_90;
  ArrayPtr<const_unsigned_char> local_50;
  StringPtr local_40;
  int64_t local_30;
  undefined2 local_28;
  undefined6 uStack_26;
  Orphan<capnp::DynamicValue> *local_18;
  Orphan<capnp::DynamicValue> *this_local;
  
  local_18 = this;
  this_local = (Orphan<capnp::DynamicValue> *)__return_storage_ptr__;
  switch(this->type) {
  case UNKNOWN:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(nullptr_t)0x0);
    break;
  case VOID:
    DynamicValue::Reader::Reader(__return_storage_ptr__);
    break;
  case BOOL:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(bool)((this->field_1).boolValue & 1));
    break;
  case INT:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(this->field_1).intValue);
    break;
  case UINT:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(this->field_1).uintValue);
    break;
  case FLOAT:
    DynamicValue::Reader::Reader(__return_storage_ptr__,(this->field_1).floatValue);
    break;
  case TEXT:
    local_40.content = (ArrayPtr<const_char>)_::OrphanBuilder::asTextReader(&this->builder);
    DynamicValue::Reader::Reader(__return_storage_ptr__,(Reader *)&local_40);
    break;
  case DATA:
    local_50 = (ArrayPtr<const_unsigned_char>)_::OrphanBuilder::asDataReader(&this->builder);
    DynamicValue::Reader::Reader(__return_storage_ptr__,(Reader *)&local_50);
    break;
  case LIST:
    local_a0 = (this->field_1).intValue;
    local_98 = (anon_union_8_2_eba6ea51_for_Type_5)
               ((anon_union_8_2_eba6ea51_for_Type_5 *)((long)&this->field_1 + 8))->schema;
    elementType = ListSchema::whichElementType(&(this->field_1).listSchema);
    elementSize = anon_unknown_70::elementSizeFor(elementType);
    _::OrphanBuilder::asListReader(&local_d0,&this->builder,elementSize);
    schema.elementType.field_4.schema = local_98.schema;
    schema.elementType.baseType = (undefined2)local_a0;
    schema.elementType.listDepth = local_a0._2_1_;
    schema.elementType.isImplicitParam = (bool)local_a0._3_1_;
    schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_a0._4_2_;
    schema.elementType._6_2_ = local_a0._6_2_;
    reader.capTable = local_d0.capTable;
    reader.segment = local_d0.segment;
    reader.ptr = local_d0.ptr;
    reader.elementCount = local_d0.elementCount;
    reader.step = local_d0.step;
    reader.structDataSize = local_d0.structDataSize;
    reader.structPointerCount = local_d0.structPointerCount;
    reader.elementSize = local_d0.elementSize;
    reader._39_1_ = local_d0._39_1_;
    reader.nestingLimit = local_d0.nestingLimit;
    reader._44_4_ = local_d0._44_4_;
    DynamicList::Reader::Reader(&local_90,schema,reader);
    DynamicValue::Reader::Reader(__return_storage_ptr__,&local_90);
    break;
  case ENUM:
    local_30 = (this->field_1).intValue;
    uVar1 = *(undefined8 *)((long)&this->field_1 + 8);
    local_28 = (undefined2)uVar1;
    uStack_26 = (undefined6)((ulong)uVar1 >> 0x10);
    value._10_6_ = 0;
    value._0_10_ = *(unkuint10 *)&this->field_1;
    DynamicValue::Reader::Reader(__return_storage_ptr__,value);
    break;
  case STRUCT:
    local_110.raw = (this->field_1).structSchema.super_Schema.raw;
    local_150.raw = (this->field_1).structSchema.super_Schema.raw;
    local_144 = anon_unknown_70::structSizeFromSchema((StructSchema)local_150.raw);
    _::OrphanBuilder::asStructReader(&local_140,&this->builder,local_144);
    reader_00.capTable = local_140.capTable;
    reader_00.segment = local_140.segment;
    reader_00.data = local_140.data;
    reader_00.pointers = local_140.pointers;
    reader_00.dataSize = local_140.dataSize;
    reader_00.pointerCount = local_140.pointerCount;
    reader_00._38_2_ = local_140._38_2_;
    reader_00.nestingLimit = local_140.nestingLimit;
    reader_00._44_4_ = local_140._44_4_;
    DynamicStruct::Reader::Reader(&local_108,(StructSchema)local_110.raw,reader_00);
    DynamicValue::Reader::Reader(__return_storage_ptr__,&local_108);
    break;
  case CAPABILITY:
    local_180._16_8_ = (this->field_1).interfaceSchema.super_Schema.raw;
    _::OrphanBuilder::asCapability((OrphanBuilder *)local_180);
    DynamicCapability::Client::Client
              ((Client *)(local_180 + 0x18),(InterfaceSchema)local_180._16_8_,
               (Own<capnp::ClientHook> *)local_180);
    DynamicValue::Reader::Reader(__return_storage_ptr__,(Client *)(local_180 + 0x18));
    DynamicCapability::Client::~Client((Client *)(local_180 + 0x18));
    kj::Own<capnp::ClientHook>::~Own((Own<capnp::ClientHook> *)local_180);
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[100]>
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x845,FAILED,(char *)0x0,
               "\"Can\'t get() an AnyPointer orphan; there is no underlying pointer to \" \"wrap in an AnyPointer::Builder.\""
               ,(char (*) [100])
                "Can\'t get() an AnyPointer orphan; there is no underlying pointer to wrap in an AnyPointer::Builder."
              );
    kj::_::Debug::Fault::fatal(&local_198);
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Reader Orphan<DynamicValue>::getReader() const {
  switch (type) {
    case DynamicValue::UNKNOWN: return nullptr;
    case DynamicValue::VOID: return voidValue;
    case DynamicValue::BOOL: return boolValue;
    case DynamicValue::INT: return intValue;
    case DynamicValue::UINT: return uintValue;
    case DynamicValue::FLOAT: return floatValue;
    case DynamicValue::ENUM: return enumValue;

    case DynamicValue::TEXT: return builder.asTextReader();
    case DynamicValue::DATA: return builder.asDataReader();
    case DynamicValue::LIST:
      return DynamicList::Reader(listSchema,
          builder.asListReader(elementSizeFor(listSchema.whichElementType())));
    case DynamicValue::STRUCT:
      return DynamicStruct::Reader(structSchema,
          builder.asStructReader(structSizeFromSchema(structSchema)));
    case DynamicValue::CAPABILITY:
      return DynamicCapability::Client(interfaceSchema, builder.asCapability());
    case DynamicValue::ANY_POINTER:
      KJ_FAIL_ASSERT("Can't get() an AnyPointer orphan; there is no underlying pointer to "
                     "wrap in an AnyPointer::Builder.");
  }
  KJ_UNREACHABLE;
}